

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

ARKInterp arkInterpCreate_Hermite(ARKodeMem_conflict ark_mem,int degree)

{
  sunrealtype sVar1;
  ARKInterp __ptr;
  ARKInterpOps __ptr_00;
  int *piVar2;
  
  if (((uint)degree < 6) && (__ptr = (ARKInterp)malloc(0x10), __ptr != (ARKInterp)0x0)) {
    __ptr_00 = (ARKInterpOps)malloc(0x38);
    if (__ptr_00 != (ARKInterpOps)0x0) {
      __ptr_00->resize = arkInterpResize_Hermite;
      __ptr_00->free = arkInterpFree_Hermite;
      __ptr_00->print = arkInterpPrintMem_Hermite;
      __ptr_00->setdegree = arkInterpSetDegree_Hermite;
      __ptr_00->init = arkInterpInit_Hermite;
      __ptr_00->update = arkInterpUpdate_Hermite;
      __ptr_00->evaluate = arkInterpEvaluate_Hermite;
      piVar2 = (int *)calloc(1,0x40);
      if (piVar2 != (int *)0x0) {
        __ptr->ops = __ptr_00;
        __ptr->content = piVar2;
        *piVar2 = degree;
        ark_mem->lrw = ark_mem->lrw + 2;
        ark_mem->liw = ark_mem->liw + 5;
        sVar1 = ark_mem->tcur;
        *(sunrealtype *)(piVar2 + 10) = sVar1;
        *(sunrealtype *)(piVar2 + 0xc) = sVar1;
        return __ptr;
      }
      free(__ptr_00);
    }
    free(__ptr);
  }
  return (ARKInterp)0x0;
}

Assistant:

ARKInterp arkInterpCreate_Hermite(ARKodeMem ark_mem, int degree)
{
  ARKInterp interp;
  ARKInterpContent_Hermite content;
  ARKInterpOps ops;

  /* check for valid degree */
  if (degree < 0 || degree > ARK_INTERP_MAX_DEGREE) { return (NULL); }

  /* allocate overall structure */
  interp = NULL;
  interp = (ARKInterp)malloc(sizeof *interp);
  if (interp == NULL) { return (NULL); }

  /* allocate ops structure and set entries */
  ops = NULL;
  ops = (ARKInterpOps)malloc(sizeof *ops);
  if (ops == NULL)
  {
    free(interp);
    return (NULL);
  }
  ops->resize    = arkInterpResize_Hermite;
  ops->free      = arkInterpFree_Hermite;
  ops->print     = arkInterpPrintMem_Hermite;
  ops->setdegree = arkInterpSetDegree_Hermite;
  ops->init      = arkInterpInit_Hermite;
  ops->update    = arkInterpUpdate_Hermite;
  ops->evaluate  = arkInterpEvaluate_Hermite;

  /* create content, and initialize everything to zero/NULL */
  content = NULL;
  content = (ARKInterpContent_Hermite)malloc(sizeof *content);
  if (content == NULL)
  {
    free(ops);
    free(interp);
    return (NULL);
  }
  memset(content, 0, sizeof(struct _ARKInterpContent_Hermite));

  /* attach ops and content structures to overall structure */
  interp->ops     = ops;
  interp->content = content;

  /* fill content */

  /* initialize local N_Vectors to NULL */
  content->fold = NULL;
  content->yold = NULL;
  content->fa   = NULL;
  content->fb   = NULL;

  /* set maximum interpolant degree */
  content->degree = SUNMIN(ARK_INTERP_MAX_DEGREE, degree);

  /* update workspace sizes */
  ark_mem->lrw += 2;
  ark_mem->liw += 5;

  /* initialize time values */
  content->told = ark_mem->tcur;
  content->tnew = ark_mem->tcur;
  content->h    = SUN_RCONST(0.0);

  return (interp);
}